

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_tests.cpp
# Opt level: O0

int __thiscall fs_tests::rename::rename(rename *this,char *__old,char *__new)

{
  long lVar1;
  long in_FS_OFFSET;
  TestOpts *in_stack_00000130;
  ChainType in_stack_0000013c;
  BasicTestingSetup *in_stack_00000140;
  TestOpts *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&in_stack_ffffffffffffffa8->extra_args);
  BasicTestingSetup::BasicTestingSetup(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
  TestOpts::~TestOpts(in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rename)
{
    const fs::path tmpfolder{m_args.GetDataDirBase()};

    const fs::path path1{tmpfolder / "a"};
    const fs::path path2{tmpfolder / "b"};

    const std::string path1_contents{"1111"};
    const std::string path2_contents{"2222"};

    {
        std::ofstream file{path1};
        file << path1_contents;
    }

    {
        std::ofstream file{path2};
        file << path2_contents;
    }

    // Rename path1 -> path2.
    BOOST_CHECK(RenameOver(path1, path2));

    BOOST_CHECK(!fs::exists(path1));

    {
        std::ifstream file{path2};
        std::string contents;
        file >> contents;
        BOOST_CHECK_EQUAL(contents, path1_contents);
    }
    fs::remove(path2);
}